

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O2

void __thiscall
cmCTestCurl::SetCurlOptions
          (cmCTestCurl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  pointer __lhs;
  
  for (__lhs = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __lhs != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
    bVar1 = std::operator==(__lhs,"CURLOPT_SSL_VERIFYPEER_OFF");
    if (bVar1) {
      this->VerifyPeerOff = true;
    }
    bVar1 = std::operator==(__lhs,"CURLOPT_SSL_VERIFYHOST_OFF");
    if (bVar1) {
      this->VerifyHostOff = true;
    }
  }
  return;
}

Assistant:

void cmCTestCurl::SetCurlOptions(std::vector<std::string> const& args)
{
  for( std::vector<std::string>::const_iterator i = args.begin();
       i != args.end(); ++i)
    {
    if(*i == "CURLOPT_SSL_VERIFYPEER_OFF")
      {
      this->VerifyPeerOff = true;
      }
    if(*i == "CURLOPT_SSL_VERIFYHOST_OFF")
      {
      this->VerifyHostOff = true;
      }
    }
}